

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

char * el::base::utils::DateTime::parseFormat
                 (char *buf,size_t bufSz,char *format,tm *tInfo,size_t msec,
                 SubsecondPrecision *ssPrec)

{
  char *bufLim_00;
  char *in_RCX;
  char *pcVar1;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  char *in_R8;
  undefined8 in_R9;
  char *bufLim;
  char *local_48;
  bool zeroPadded;
  int len;
  char *local_8;
  
  bufLim_00 = in_RDI + in_RSI;
  local_8 = in_RDI;
  do {
    if (*in_RDX == '\0') {
      return local_8;
    }
    pcVar1 = in_RDX;
    if (*in_RDX != '%') goto LAB_00229ad2;
    pcVar1 = in_RDX + 1;
    zeroPadded = SUB81((ulong)in_R9 >> 0x38,0);
    len = (int)((ulong)pcVar1 >> 0x20);
    switch(in_RDX[1]) {
    case '\0':
      pcVar1 = in_RDX;
      goto LAB_00229ad2;
    default:
      break;
    case '%':
LAB_00229ad2:
      if (local_8 == bufLim_00) {
        return local_8;
      }
      *local_8 = *pcVar1;
      local_8 = local_8 + 1;
      break;
    case 'A':
      local_8 = Str::addToBuff(*(char **)(consts::kDays + (long)*(int *)(in_RCX + 0x18) * 8),local_8
                               ,bufLim_00);
      break;
    case 'B':
      local_8 = Str::addToBuff(*(char **)(consts::kMonths + (long)*(int *)(in_RCX + 0x10) * 8),
                               local_8,bufLim_00);
      break;
    case 'F':
      if (*(int *)(in_RCX + 8) < 0xc) {
        local_48 = consts::kAm;
      }
      else {
        local_48 = consts::kPm;
      }
      local_8 = Str::addToBuff(local_48,local_8,bufLim_00);
      break;
    case 'H':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 'M':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 'Y':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 'a':
      local_8 = Str::addToBuff(*(char **)(consts::kDaysAbbrev + (long)*(int *)(in_RCX + 0x18) * 8),
                               local_8,bufLim_00);
      break;
    case 'b':
      local_8 = Str::addToBuff(*(char **)(consts::kMonthsAbbrev + (long)*(int *)(in_RCX + 0x10) * 8)
                               ,local_8,bufLim_00);
      break;
    case 'd':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 'g':
    case 'z':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 'h':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 'm':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 's':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
      break;
    case 'y':
      local_8 = Str::convertAndAddToBuff(in_RSI,len,in_RCX,in_R8,zeroPadded);
    }
    in_RDX = pcVar1 + 1;
  } while( true );
}

Assistant:

char* DateTime::parseFormat(char* buf, std::size_t bufSz, const char* format, const struct tm* tInfo,
                            std::size_t msec, const base::SubsecondPrecision* ssPrec) {
  const char* bufLim = buf + bufSz;
  for (; *format; ++format) {
    if (*format == base::consts::kFormatSpecifierChar) {
      switch (*++format) {
      case base::consts::kFormatSpecifierChar:  // Escape
        break;
      case '\0':  // End
        --format;
        break;
      case 'd':  // Day
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mday, 2, buf, bufLim);
        continue;
      case 'a':  // Day of week (short)
        buf = base::utils::Str::addToBuff(base::consts::kDaysAbbrev[tInfo->tm_wday], buf, bufLim);
        continue;
      case 'A':  // Day of week (long)
        buf = base::utils::Str::addToBuff(base::consts::kDays[tInfo->tm_wday], buf, bufLim);
        continue;
      case 'M':  // month
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mon + 1, 2, buf, bufLim);
        continue;
      case 'b':  // month (short)
        buf = base::utils::Str::addToBuff(base::consts::kMonthsAbbrev[tInfo->tm_mon], buf, bufLim);
        continue;
      case 'B':  // month (long)
        buf = base::utils::Str::addToBuff(base::consts::kMonths[tInfo->tm_mon], buf, bufLim);
        continue;
      case 'y':  // year (two digits)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 2, buf, bufLim);
        continue;
      case 'Y':  // year (four digits)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 4, buf, bufLim);
        continue;
      case 'h':  // hour (12-hour)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour % 12, 2, buf, bufLim);
        continue;
      case 'H':  // hour (24-hour)
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour, 2, buf, bufLim);
        continue;
      case 'm':  // minute
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_min, 2, buf, bufLim);
        continue;
      case 's':  // second
        buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_sec, 2, buf, bufLim);
        continue;
      case 'z':  // subsecond part
      case 'g':
        buf = base::utils::Str::convertAndAddToBuff(msec, ssPrec->m_width, buf, bufLim);
        continue;
      case 'F':  // AM/PM
        buf = base::utils::Str::addToBuff((tInfo->tm_hour >= 12) ? base::consts::kPm : base::consts::kAm, buf, bufLim);
        continue;
      default:
        continue;
      }
    }
    if (buf == bufLim) break;
    *buf++ = *format;
  }
  return buf;
}